

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode singlesocket(Curl_multi *multi,Curl_easy *data)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  Curl_hash *h;
  void *pvVar4;
  Curl_hash *pCVar5;
  byte bVar6;
  ulong uVar7;
  ulong uVar8;
  size_t key_len;
  Curl_easy **key;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  easy_pollset cur_poll;
  undefined1 local_64 [4];
  Curl_easy *local_60;
  uint local_58;
  int local_54;
  easy_pollset local_50;
  
  local_60 = data;
  multi_getsock(data,&local_50);
  if (local_50.num != 0) {
    pCVar5 = &multi->sockhash;
    uVar11 = 0;
    do {
      iVar3 = local_50.sockets[uVar11];
      local_64 = (undefined1  [4])iVar3;
      if (iVar3 == -1) {
        local_54 = -1;
        uVar9 = (uint)local_50.actions[uVar11];
LAB_0011219e:
        h = (Curl_hash *)(*Curl_ccalloc)(1,0x48);
        if (h == (Curl_hash *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_hash_init(h,0xd,trhash,trhash_compare,trhash_dtor);
        pvVar4 = Curl_hash_add(pCVar5,&local_54,4,h);
        if (pvVar4 == (void *)0x0) {
          Curl_hash_destroy(h);
          (*Curl_cfree)(h);
          return CURLM_OUT_OF_MEMORY;
        }
      }
      else {
        local_58 = (uint)local_50.actions[uVar11];
        h = (Curl_hash *)Curl_hash_pick(pCVar5,local_64,4);
        if (h == (Curl_hash *)0x0) {
          local_64 = (undefined1  [4])iVar3;
          local_54 = iVar3;
          h = (Curl_hash *)Curl_hash_pick(pCVar5,local_64,4);
          uVar9 = local_58;
          if (h == (Curl_hash *)0x0) goto LAB_0011219e;
        }
        else {
          uVar7 = (ulong)(local_60->last_poll).num;
          uVar9 = local_58;
          if (uVar7 != 0) {
            uVar8 = 0;
            do {
              if (iVar3 == (local_60->last_poll).sockets[uVar8]) {
                bVar6 = (local_60->last_poll).actions[uVar8];
                if (bVar6 != 0) {
                  if (bVar6 != (byte)local_58) {
                    if ((bVar6 & 1) != 0) {
                      *(int *)&h[1].comp_func = *(int *)&h[1].comp_func + -1;
                    }
                    if ((bVar6 & 2) != 0) {
                      piVar1 = (int *)((long)&h[1].comp_func + 4);
                      *piVar1 = *piVar1 + -1;
                    }
                    if ((local_58 & 1) != 0) {
                      *(int *)&h[1].comp_func = *(int *)&h[1].comp_func + 1;
                    }
                    if ((local_58 & 2) != 0) {
                      piVar1 = (int *)((long)&h[1].comp_func + 4);
                      *piVar1 = *piVar1 + 1;
                    }
                  }
                  bVar2 = false;
                  goto LAB_001122a3;
                }
                break;
              }
              uVar8 = uVar8 + 1;
            } while (uVar7 != uVar8);
          }
        }
      }
      piVar1 = (int *)((long)&h[1].table + 4);
      *piVar1 = *piVar1 + 1;
      if ((uVar9 & 1) != 0) {
        *(int *)&h[1].comp_func = *(int *)&h[1].comp_func + 1;
      }
      if ((uVar9 & 2) != 0) {
        piVar1 = (int *)((long)&h[1].comp_func + 4);
        *piVar1 = *piVar1 + 1;
      }
      pvVar4 = Curl_hash_add(h,&local_60,8,local_60);
      bVar2 = true;
      if (pvVar4 == (void *)0x0) {
        Curl_hash_destroy(h);
        return CURLM_OUT_OF_MEMORY;
      }
LAB_001122a3:
      iVar10 = (uint)(*(int *)&h[1].comp_func != 0) +
               (uint)(*(int *)((long)&h[1].comp_func + 4) != 0) * 2;
      if ((bVar2) || (*(int *)&h[1].table != iVar10)) {
        if (multi->socket_cb != (curl_socket_callback)0x0) {
          multi->field_0x1b1 = multi->field_0x1b1 | 4;
          iVar3 = (*multi->socket_cb)(local_60,iVar3,iVar10,multi->socket_userp,h[1].hash_func);
          bVar6 = multi->field_0x1b1 & 0xfb;
          multi->field_0x1b1 = bVar6;
          if (iVar3 == -1) goto LAB_00112462;
        }
        *(int *)&h[1].table = iVar10;
      }
      uVar11 = uVar11 + 1;
      data = local_60;
    } while (uVar11 < local_50.num);
  }
  if ((data->last_poll).num != 0) {
    uVar11 = 0;
    do {
      iVar3 = (data->last_poll).sockets[uVar11];
      if ((ulong)local_50.num != 0) {
        uVar7 = 0;
        do {
          if (iVar3 == local_50.sockets[uVar7]) goto LAB_00112422;
          uVar7 = uVar7 + 1;
        } while (local_50.num != uVar7);
      }
      if ((iVar3 != -1) &&
         (local_64 = (undefined1  [4])iVar3,
         pCVar5 = (Curl_hash *)Curl_hash_pick(&multi->sockhash,local_64,4),
         pCVar5 != (Curl_hash *)0x0)) {
        bVar6 = (local_60->last_poll).actions[uVar11];
        iVar10 = *(int *)((long)&pCVar5[1].table + 4) + -1;
        *(int *)((long)&pCVar5[1].table + 4) = iVar10;
        if ((bVar6 & 2) != 0) {
          piVar1 = (int *)((long)&pCVar5[1].comp_func + 4);
          *piVar1 = *piVar1 + -1;
        }
        if ((bVar6 & 1) != 0) {
          *(int *)&pCVar5[1].comp_func = *(int *)&pCVar5[1].comp_func + -1;
        }
        if (iVar10 == 0) {
          if (multi->socket_cb != (curl_socket_callback)0x0) {
            multi->field_0x1b1 = multi->field_0x1b1 | 4;
            iVar10 = (*multi->socket_cb)(local_60,iVar3,4,multi->socket_userp,pCVar5[1].hash_func);
            bVar6 = multi->field_0x1b1 & 0xfb;
            multi->field_0x1b1 = bVar6;
            if (iVar10 == -1) {
LAB_00112462:
              multi->field_0x1b1 = bVar6 | 0x10;
              return CURLM_ABORTED_BY_CALLBACK;
            }
          }
          local_64 = (undefined1  [4])iVar3;
          Curl_hash_destroy(pCVar5);
          key_len = 4;
          key = (Curl_easy **)local_64;
          pCVar5 = &multi->sockhash;
        }
        else {
          key_len = 8;
          key = &local_60;
        }
        Curl_hash_delete(pCVar5,key,key_len);
      }
LAB_00112422:
      uVar11 = uVar11 + 1;
      data = local_60;
    } while (uVar11 < (local_60->last_poll).num);
  }
  *(ulong *)((data->last_poll).sockets + 4) = CONCAT44(local_50.num,local_50.sockets[4]);
  (data->last_poll).actions[0] = local_50.actions[0];
  (data->last_poll).actions[1] = local_50.actions[1];
  (data->last_poll).actions[2] = local_50.actions[2];
  (data->last_poll).actions[3] = local_50.actions[3];
  (data->last_poll).actions[4] = local_50.actions[4];
  *(undefined3 *)&(data->last_poll).field_0x1d = local_50._29_3_;
  *(undefined8 *)(data->last_poll).sockets = local_50.sockets._0_8_;
  *(undefined8 *)((data->last_poll).sockets + 2) = local_50.sockets._8_8_;
  return CURLM_OK;
}

Assistant:

static CURLMcode singlesocket(struct Curl_multi *multi,
                              struct Curl_easy *data)
{
  struct easy_pollset cur_poll;
  unsigned int i;
  struct Curl_sh_entry *entry;
  curl_socket_t s;
  int rc;

  /* Fill in the 'current' struct with the state as it is now: what sockets to
     supervise and for what actions */
  multi_getsock(data, &cur_poll);

  /* We have 0 .. N sockets already and we get to know about the 0 .. M
     sockets we should have from now on. Detect the differences, remove no
     longer supervised ones and add new ones */

  /* walk over the sockets we got right now */
  for(i = 0; i < cur_poll.num; i++) {
    unsigned char cur_action = cur_poll.actions[i];
    unsigned char last_action = 0;
    int comboaction;

    s = cur_poll.sockets[i];

    /* get it from the hash */
    entry = sh_getentry(&multi->sockhash, s);
    if(entry) {
      /* check if new for this transfer */
      unsigned int j;
      for(j = 0; j< data->last_poll.num; j++) {
        if(s == data->last_poll.sockets[j]) {
          last_action = data->last_poll.actions[j];
          break;
        }
      }
    }
    else {
      /* this is a socket we didn't have before, add it to the hash! */
      entry = sh_addentry(&multi->sockhash, s);
      if(!entry)
        /* fatal */
        return CURLM_OUT_OF_MEMORY;
    }
    if(last_action && (last_action != cur_action)) {
      /* Socket was used already, but different action now */
      if(last_action & CURL_POLL_IN)
        entry->readers--;
      if(last_action & CURL_POLL_OUT)
        entry->writers--;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;
    }
    else if(!last_action) {
      /* a new transfer using this socket */
      entry->users++;
      if(cur_action & CURL_POLL_IN)
        entry->readers++;
      if(cur_action & CURL_POLL_OUT)
        entry->writers++;

      /* add 'data' to the transfer hash on this socket! */
      if(!Curl_hash_add(&entry->transfers, (char *)&data, /* hash key */
                        sizeof(struct Curl_easy *), data)) {
        Curl_hash_destroy(&entry->transfers);
        return CURLM_OUT_OF_MEMORY;
      }
    }

    comboaction = (entry->writers ? CURL_POLL_OUT : 0) |
                   (entry->readers ? CURL_POLL_IN : 0);

    /* socket existed before and has the same action set as before */
    if(last_action && ((int)entry->action == comboaction))
      /* same, continue */
      continue;

    if(multi->socket_cb) {
      set_in_callback(multi, TRUE);
      rc = multi->socket_cb(data, s, comboaction, multi->socket_userp,
                            entry->socketp);

      set_in_callback(multi, FALSE);
      if(rc == -1) {
        multi->dead = TRUE;
        return CURLM_ABORTED_BY_CALLBACK;
      }
    }

    entry->action = comboaction; /* store the current action state */
  }

  /* Check for last_poll.sockets that no longer appear in cur_poll.sockets.
   * Need to remove the easy handle from the multi->sockhash->transfers and
   * remove multi->sockhash entry when this was the last transfer */
  for(i = 0; i< data->last_poll.num; i++) {
    unsigned int j;
    bool stillused = FALSE;
    s = data->last_poll.sockets[i];
    for(j = 0; j < cur_poll.num; j++) {
      if(s == cur_poll.sockets[j]) {
        /* this is still supervised */
        stillused = TRUE;
        break;
      }
    }
    if(stillused)
      continue;

    entry = sh_getentry(&multi->sockhash, s);
    /* if this is NULL here, the socket has been closed and notified so
       already by Curl_multi_closed() */
    if(entry) {
      unsigned char oldactions = data->last_poll.actions[i];
      /* this socket has been removed. Decrease user count */
      entry->users--;
      if(oldactions & CURL_POLL_OUT)
        entry->writers--;
      if(oldactions & CURL_POLL_IN)
        entry->readers--;
      if(!entry->users) {
        if(multi->socket_cb) {
          set_in_callback(multi, TRUE);
          rc = multi->socket_cb(data, s, CURL_POLL_REMOVE,
                                multi->socket_userp, entry->socketp);
          set_in_callback(multi, FALSE);
          if(rc == -1) {
            multi->dead = TRUE;
            return CURLM_ABORTED_BY_CALLBACK;
          }
        }
        sh_delentry(entry, &multi->sockhash, s);
      }
      else {
        /* still users, but remove this handle as a user of this socket */
        if(Curl_hash_delete(&entry->transfers, (char *)&data,
                            sizeof(struct Curl_easy *))) {
          DEBUGASSERT(NULL);
        }
      }
    }
  } /* for loop over num */

  /* Remember for next time */
  memcpy(&data->last_poll, &cur_poll, sizeof(data->last_poll));
  return CURLM_OK;
}